

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.h
# Opt level: O0

InProcCodeGenAllocators * __thiscall
NativeCodeGenerator::CreateAllocators(NativeCodeGenerator *this,PageAllocator *pageAllocator)

{
  ScriptContext *this_00;
  HeapAllocator *alloc;
  CodeGenAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_01;
  AllocationPolicyManager *policyManager;
  ThreadContext *pTVar1;
  InProcCodePageAllocators *codePageAllocators;
  HANDLE processHandle;
  ThreadContextInfo *local_b0;
  TrackAllocData local_40;
  PageAllocator *local_18;
  PageAllocator *pageAllocator_local;
  NativeCodeGenerator *this_local;
  
  local_18 = pageAllocator;
  pageAllocator_local = (PageAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)
             &CodeGenAllocators<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.h"
             ,0x88);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
  this_01 = (CodeGenAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
             *)new<Memory::HeapAllocator>(0x460,alloc,0x350bd0);
  policyManager =
       Memory::
       PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
       ::GetAllocationPolicyManager(local_18);
  this_00 = this->scriptContext;
  pTVar1 = Js::ScriptContext::GetThreadContext(this_00);
  local_b0 = (ThreadContextInfo *)0x0;
  if (pTVar1 != (ThreadContext *)0x0) {
    local_b0 = &pTVar1->super_ThreadContextInfo;
  }
  pTVar1 = Js::ScriptContext::GetThreadContext(this->scriptContext);
  codePageAllocators = ThreadContext::GetCodePageAllocators(pTVar1);
  processHandle = GetCurrentProcess();
  CodeGenAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  CodeGenAllocators(this_01,policyManager,this_00,local_b0,codePageAllocators,processHandle);
  return this_01;
}

Assistant:

InProcCodeGenAllocators *CreateAllocators(PageAllocator *const pageAllocator)
    {
        return HeapNew(InProcCodeGenAllocators, pageAllocator->GetAllocationPolicyManager(), scriptContext, scriptContext->GetThreadContext(), scriptContext->GetThreadContext()->GetCodePageAllocators(), GetCurrentProcess());
    }